

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate<false>
          (RepeatedField<unsigned_int> *this)

{
  uint uVar1;
  int iVar2;
  void *ptr;
  RepeatedField<unsigned_long> *this_00;
  uint size;
  int in_ESI;
  undefined1 *puVar3;
  LongSooRep *this_01;
  SooRep *pSVar4;
  Arena *this_02;
  SooRep *unaff_R14;
  Arena *pAStack_88;
  ulong uStack_80;
  SooRep *pSStack_78;
  undefined1 auStack_40 [8];
  code *pcStack_38;
  undefined8 uStack_20;
  SooRep local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    uStack_20 = 0x263902;
    InternalDeallocate<false>(this);
    return;
  }
  pSVar4 = &local_10;
  uStack_20 = 0x263911;
  InternalDeallocate<false>((RepeatedField<unsigned_int> *)pSVar4);
  iVar2 = 2;
  if (in_ESI == 0) {
    iVar2 = (pSVar4->field_0).long_rep.capacity;
  }
  if ((int)size <= iVar2) {
    internal::SooRep::set_size(pSVar4,SUB41(in_ESI,0),size);
    return;
  }
  this_01 = (LongSooRep *)(ulong)size;
  pcStack_38 = RepeatedField<unsigned_long>::elements;
  set_size();
  uVar1 = 1;
  if (iVar2 == 0) {
    uVar1 = this_01->capacity;
  }
  if (0 < (int)uVar1) {
    if ((char)iVar2 != '\0') {
      return;
    }
    internal::LongSooRep::elements(this_01);
    return;
  }
  puVar3 = auStack_40;
  pSVar4 = (SooRep *)(ulong)uVar1;
  RepeatedField<unsigned_long>::elements();
  if ((int)puVar3 < 0) {
    pSStack_78 = (SooRep *)0x2639c0;
    RepeatedField<unsigned_long>::Mutable();
  }
  else {
    pSStack_78 = (SooRep *)0x263990;
    iVar2 = internal::SooRep::size
                      (pSVar4,(undefined1  [16])
                              ((undefined1  [16])pSVar4->field_0 & (undefined1  [16])0x4) ==
                              (undefined1  [16])0x0);
    unaff_R14 = pSVar4;
    if ((int)puVar3 < iVar2) {
      pSStack_78 = (SooRep *)0x2639a6;
      RepeatedField<unsigned_long>::elements
                ((RepeatedField<unsigned_long> *)pSVar4,
                 (undefined1  [16])((undefined1  [16])pSVar4->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  this_02 = (Arena *)((ulong)puVar3 & 0xffffffff);
  pSStack_78 = (SooRep *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>;
  RepeatedField<unsigned_long>::Mutable();
  uStack_80 = (ulong)puVar3 & 0xffffffff;
  pSStack_78 = unaff_R14;
  if (this_02 == (Arena *)0x0) {
    this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
    RepeatedField<unsigned_long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_02,0x10);
    pAStack_88 = this_02;
    Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_88);
  }
  return;
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }